

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::ObjectEnd(ParsedScene *this,FileLoc loc)

{
  char cVar1;
  pointer pGVar2;
  char *pcVar3;
  int iVar4;
  undefined8 in_RAX;
  pointer ppVar5;
  GraphicsState *this_00;
  long in_FS_OFFSET;
  undefined6 uStack_28;
  char vb;
  char va;
  
  if (this->currentBlock == OptionsBlock) {
    ErrorExit<char_const(&)[10]>
              (&loc,"Scene description must be inside world block; \"%s\" is not allowed.",
               (char (*) [10])0x2c8dc18);
  }
  if (this->currentInstance == (InstanceDefinitionSceneEntity *)0x0) {
    (this->super_SceneRepresentation).errorExit = true;
    Error(&loc,"ObjectEnd called outside of instance definition");
  }
  else {
    this->currentInstance = (InstanceDefinitionSceneEntity *)0x0;
    pGVar2 = (this->pushedGraphicsStates).
             super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _uStack_28 = in_RAX;
    std::__cxx11::string::operator=((string *)&this->graphicsState,(string *)(pGVar2 + -1));
    std::__cxx11::string::operator=
              ((string *)&(this->graphicsState).currentOutsideMedium,
               (string *)&pGVar2[-1].currentOutsideMedium);
    (this->graphicsState).currentMaterialIndex = pGVar2[-1].currentMaterialIndex;
    std::__cxx11::string::operator=
              ((string *)&(this->graphicsState).currentMaterialName,
               (string *)&pGVar2[-1].currentMaterialName);
    std::__cxx11::string::operator=
              ((string *)&(this->graphicsState).areaLightName,(string *)&pGVar2[-1].areaLightName);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->graphicsState).areaLightParams.params,&pGVar2[-1].areaLightParams.params);
    (this->graphicsState).areaLightParams.colorSpace = pGVar2[-1].areaLightParams.colorSpace;
    iVar4 = pGVar2[-1].areaLightLoc.column;
    (this->graphicsState).areaLightLoc.line = pGVar2[-1].areaLightLoc.line;
    (this->graphicsState).areaLightLoc.column = iVar4;
    pcVar3 = pGVar2[-1].areaLightLoc.filename._M_str;
    (this->graphicsState).areaLightLoc.filename._M_len = pGVar2[-1].areaLightLoc.filename._M_len;
    (this->graphicsState).areaLightLoc.filename._M_str = pcVar3;
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->graphicsState).shapeAttributes,&pGVar2[-1].shapeAttributes);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->graphicsState).lightAttributes,&pGVar2[-1].lightAttributes);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->graphicsState).materialAttributes,&pGVar2[-1].materialAttributes);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->graphicsState).mediumAttributes,&pGVar2[-1].mediumAttributes);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->graphicsState).textureAttributes,&pGVar2[-1].textureAttributes);
    memcpy(&(this->graphicsState).reverseOrientation,&pGVar2[-1].reverseOrientation,0x11c);
    this_00 = (this->pushedGraphicsStates).
              super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    (this->pushedGraphicsStates).
    super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ._M_impl.super__Vector_impl_data._M_finish = this_00;
    GraphicsState::~GraphicsState(this_00);
    *(long *)(in_FS_OFFSET + -0x28) = *(long *)(in_FS_OFFSET + -0x28) + 1;
    ppVar5 = (this->pushStack).
             super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    cVar1 = ppVar5[-1].first;
    if (cVar1 == 'a') {
      SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
                (&this->super_SceneRepresentation,&loc,
                 "Mismatched nesting: open AttributeBegin from %s at ObjectEnd",&ppVar5[-1].second);
      ppVar5 = (this->pushStack).
               super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      _uStack_28 = CONCAT17(cVar1,CONCAT16(0x6f,uStack_28));
      if (cVar1 != 'o') {
        LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                   ,0x15b,"Check failed: %s == %s with %s = %s, %s = %s",
                   (char (*) [23])"pushStack.back().first",(char (*) [4])"\'o\'",
                   (char (*) [23])"pushStack.back().first",&va,(char (*) [4])"\'o\'",&vb);
      }
    }
    (this->pushStack).
    super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
  }
  return;
}

Assistant:

void ParsedScene::ObjectEnd(FileLoc loc) {
    VERIFY_WORLD("ObjectEnd");
    if (currentInstance == nullptr) {
        ErrorExitDeferred(&loc, "ObjectEnd called outside of instance definition");
        return;
    }
    currentInstance = nullptr;

    // NOTE: Must keep the following consistent with AttributeEnd
    graphicsState = std::move(pushedGraphicsStates.back());
    pushedGraphicsStates.pop_back();

    ++nObjectInstancesCreated;

    if (pushStack.back().first == 'a')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open AttributeBegin from %s at ObjectEnd",
                          pushStack.back().second);
    else
        CHECK_EQ(pushStack.back().first, 'o');
    pushStack.pop_back();
}